

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O0

upb_ExtensionRegistry * upb_ExtensionRegistry_New(upb_Arena *arena)

{
  _Bool _Var1;
  upb_ExtensionRegistry *r;
  upb_Arena *arena_local;
  
  arena_local = (upb_Arena *)upb_Arena_Malloc(arena,0x18);
  if (arena_local == (upb_Arena *)0x0) {
    arena_local = (upb_Arena *)0x0;
  }
  else {
    arena_local->ptr_dont_copy_me__upb_internal_use_only = (char *)arena;
    _Var1 = upb_strtable_init((upb_strtable *)&arena_local->end_dont_copy_me__upb_internal_use_only,
                              8,arena);
    if (!_Var1) {
      arena_local = (upb_Arena *)0x0;
    }
  }
  return (upb_ExtensionRegistry *)arena_local;
}

Assistant:

upb_ExtensionRegistry* upb_ExtensionRegistry_New(upb_Arena* arena) {
  upb_ExtensionRegistry* r = upb_Arena_Malloc(arena, sizeof(*r));
  if (!r) return NULL;
  r->arena = arena;
  if (!upb_strtable_init(&r->exts, 8, arena)) return NULL;
  return r;
}